

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Man_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  int f_local;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  p_local = (Ssw_Man_t *)Ssw_ObjFrame(p,pObj,f);
  if (p_local == (Ssw_Man_t *)0x0) {
    iVar1 = Saig_ObjIsPi(p->pAig,pObj);
    if (iVar1 != 0) {
      __assert_fail("!Saig_ObjIsPi(p->pAig, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                    ,0x178,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
    iVar1 = Saig_ObjIsLo(p->pAig,pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                      ,0x182,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar2 = Aig_ObjFanin0(pObj);
      Ssw_ManSweepBmcConstr_rec(p,pAVar2,f);
      pAVar2 = Aig_ObjFanin1(pObj);
      Ssw_ManSweepBmcConstr_rec(p,pAVar2,f);
      p_00 = p->pFrames;
      pAVar2 = Ssw_ObjChild0Fra(p,pObj,f);
      pAVar3 = Ssw_ObjChild1Fra(p,pObj,f);
      pObjLi = Aig_And(p_00,pAVar2,pAVar3);
    }
    else {
      if (f < 1) {
        __assert_fail("f > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                      ,0x17b,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
      pAVar3 = Aig_ObjFanin0(pAVar2);
      pAVar3 = Ssw_ManSweepBmcConstr_rec(p,pAVar3,f + -1);
      iVar1 = Aig_ObjFaninC0(pAVar2);
      pObjLi = Aig_NotCond(pAVar3,iVar1);
    }
    Ssw_ObjSetFrame(p,pObj,f,pObjLi);
    if (pObjLi == (Aig_Obj_t *)0x0) {
      __assert_fail("pObjNew != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                    ,0x188,"Aig_Obj_t *Ssw_ManSweepBmcConstr_rec(Ssw_Man_t *, Aig_Obj_t *, int)");
    }
    p_local = (Ssw_Man_t *)pObjLi;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Ssw_ManSweepBmcConstr_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pObjNew, * pObjLi;
    pObjNew = Ssw_ObjFrame( p, pObj, f );
    if ( pObjNew )
        return pObjNew;
    assert( !Saig_ObjIsPi(p->pAig, pObj) );
    if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( f > 0 );
        pObjLi  = Saig_ObjLoToLi( p->pAig, pObj );
        pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObjLi), f-1 );
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObjLi) );
    }
    else
    {
        assert( Aig_ObjIsNode(pObj) );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
        Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin1(pObj), f );
        pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
    }
    Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    assert( pObjNew != NULL );
    return pObjNew;
}